

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh_builder_sah.cpp
# Opt level: O3

Builder * embree::sse2::BVH4Quad4iMeshBuilderSAH(void *bvh,QuadMesh *mesh,uint geomID,size_t mode)

{
  _func_int **pp_Var1;
  Builder *pBVar2;
  __int_type_conflict _Var3;
  
  pBVar2 = (Builder *)operator_new(0xa8);
  (pBVar2->super_RefCount).refCounter.super___atomic_base<unsigned_long>._M_i = 0;
  (pBVar2->super_RefCount)._vptr_RefCount = (_func_int **)&PTR__BVHNBuilderSAH_0218cae8;
  pBVar2[1].super_RefCount._vptr_RefCount = (_func_int **)bvh;
  pBVar2[1].super_RefCount.refCounter.super___atomic_base<unsigned_long>._M_i = 0;
  pBVar2[2].super_RefCount._vptr_RefCount = (_func_int **)mesh;
  _Var3 = *(long *)((long)bvh + 0x60) + 0x550;
  if (*(long *)((long)bvh + 0x60) == 0) {
    _Var3 = 0;
  }
  pBVar2[2].super_RefCount.refCounter.super___atomic_base<unsigned_long>._M_i = _Var3;
  *(undefined1 *)&pBVar2[3].super_RefCount._vptr_RefCount = 0;
  pBVar2[4].super_RefCount.refCounter.super___atomic_base<unsigned_long>._M_i = 0;
  pBVar2[3].super_RefCount.refCounter.super___atomic_base<unsigned_long>._M_i = 0;
  pBVar2[4].super_RefCount._vptr_RefCount = (_func_int **)0x0;
  pBVar2[5].super_RefCount._vptr_RefCount = (_func_int **)0x2;
  pBVar2[5].super_RefCount.refCounter.super___atomic_base<unsigned_long>._M_i = 0x20;
  for (pp_Var1 = (_func_int **)0x3f; 4UL >> (long)pp_Var1 == 0;
      pp_Var1 = (_func_int **)((long)pp_Var1 + -1)) {
  }
  pBVar2[6].super_RefCount._vptr_RefCount = pp_Var1;
  pBVar2[6].super_RefCount.refCounter.super___atomic_base<unsigned_long>._M_i = 4;
  pBVar2[7].super_RefCount._vptr_RefCount = (_func_int **)0x1c;
  pBVar2[7].super_RefCount.refCounter.super___atomic_base<unsigned_long>._M_i = 0x3f8000003f800000;
  pBVar2[8].super_RefCount._vptr_RefCount = (_func_int **)0x400;
  pBVar2[8].super_RefCount.refCounter.super___atomic_base<unsigned_long>._M_i = 0xffffffffffffffff;
  pBVar2[9].super_RefCount._vptr_RefCount = (_func_int **)0x200000;
  *(uint *)&pBVar2[9].super_RefCount.refCounter.super___atomic_base<unsigned_long>._M_i = geomID;
  *(undefined1 *)
   ((long)&pBVar2[9].super_RefCount.refCounter.super___atomic_base<unsigned_long>._M_i + 4) = 0;
  *(undefined4 *)&pBVar2[10].super_RefCount._vptr_RefCount = 0;
  return pBVar2;
}

Assistant:

Builder* BVH4Quad4iMeshBuilderSAH     (void* bvh, QuadMesh* mesh, unsigned int geomID, size_t mode)     { return new BVHNBuilderSAH<4,Quad4i>((BVH4*)bvh,mesh,geomID,4,1.0f,4,inf,QuadMesh::geom_type); }